

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O1

ssize_t uv__recvmsg(int fd,msghdr *msg,int flags)

{
  ssize_t sVar1;
  int *piVar2;
  
  sVar1 = recvmsg(fd,(msghdr *)msg,flags | 0x40000000);
  if (sVar1 == -1) {
    piVar2 = __errno_location();
    sVar1 = -(long)*piVar2;
  }
  return sVar1;
}

Assistant:

ssize_t uv__recvmsg(int fd, struct msghdr* msg, int flags) {
#if defined(__ANDROID__)   || \
    defined(__DragonFly__) || \
    defined(__FreeBSD__)   || \
    defined(__NetBSD__)    || \
    defined(__OpenBSD__)   || \
    defined(__linux__)
  ssize_t rc;
  rc = recvmsg(fd, msg, flags | MSG_CMSG_CLOEXEC);
  if (rc == -1)
    return UV__ERR(errno);
  return rc;
#else
  struct cmsghdr* cmsg;
  int* pfd;
  int* end;
  ssize_t rc;
  rc = recvmsg(fd, msg, flags);
  if (rc == -1)
    return UV__ERR(errno);
  if (msg->msg_controllen == 0)
    return rc;
  for (cmsg = CMSG_FIRSTHDR(msg); cmsg != NULL; cmsg = CMSG_NXTHDR(msg, cmsg))
    if (cmsg->cmsg_type == SCM_RIGHTS)
      for (pfd = (int*) CMSG_DATA(cmsg),
           end = (int*) ((char*) cmsg + cmsg->cmsg_len);
           pfd < end;
           pfd += 1)
        uv__cloexec(*pfd, 1);
  return rc;
#endif
}